

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  string escapecode;
  string escaped;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_t local_80;
  long *local_78 [2];
  long local_68 [2];
  ulong *local_58;
  string local_50;
  
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\n\r\t","");
  if (len == 0) {
    uVar7 = 0;
    bVar2 = false;
  }
  else {
    bVar2 = false;
    uVar7 = 0;
    bVar8 = false;
    bVar11 = false;
    local_80 = len;
    local_58 = usedlen;
    do {
      lVar4 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)(char)buf[uVar7]);
      bVar10 = true;
      if (lVar4 == -1) {
        bVar10 = buf[uVar7] == '\\' || buf[uVar7] == '\"';
      }
      iVar3 = isprint((uint)buf[uVar7]);
      if ((bVar10) || (iVar3 != 0)) {
        if (!bVar2) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          bVar2 = true;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (bVar10) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          bVar5 = buf[uVar7];
          if (bVar5 < 0xd) {
            if (bVar5 == 9) {
              pcVar6 = "\\t";
              goto LAB_0012e8bb;
            }
            if (bVar5 == 10) {
              pcVar6 = "\\n";
              goto LAB_0012e8bb;
            }
LAB_0012e96c:
            stringformat_abi_cxx11_(&local_50,"\\x%02x");
            std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pcVar6 = "\\r";
            if (bVar5 != 0xd) {
              if (bVar5 == 0x22) {
                pcVar6 = "\\\"";
              }
              else {
                if (bVar5 != 0x5c) goto LAB_0012e96c;
                pcVar6 = "\\\\";
              }
            }
LAB_0012e8bb:
            std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar6);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
          goto LAB_0012e8de;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (bVar2) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          bVar2 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        stringformat_abi_cxx11_(&local_a8,"%02x",(ulong)buf[uVar7]);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
LAB_0012e8de:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
      }
      bVar5 = 1;
      if (uVar7 + 1 < local_80) {
        bVar10 = bVar8;
        if (uVar7 == 0) {
          uVar1 = *buf;
          bVar11 = true;
          bVar10 = true;
          if ((uVar1 != '\n') && (uVar1 != '\r')) {
            bVar11 = uVar1 == '\0';
            bVar10 = bVar11;
          }
        }
        bVar8 = (bool)((byte)(0x2401 >> (buf[uVar7 + 1] & 0x1f)) & buf[uVar7 + 1] < 0xe);
        bVar9 = bVar11 ^ 1;
        bVar5 = bVar9 | bVar8;
        bVar11 = bVar8;
        if (bVar9 == 0 && bVar8 == false) {
          uVar7 = uVar7 + 1;
          bVar11 = bVar10;
          bVar8 = bVar10;
        }
      }
      usedlen = local_58;
    } while ((bVar5 != 0) && (uVar7 = uVar7 + 1, uVar7 < local_80));
  }
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  *usedlen = uVar7;
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}